

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Promise<unsigned_long> *
kj::_::CopyConstructArray_<kj::Promise<unsigned_long>,_kj::Promise<unsigned_long>_*,_true,_false>::
apply(Promise<unsigned_long> *pos,Promise<unsigned_long> *start,Promise<unsigned_long> *end)

{
  Promise<unsigned_long> *location;
  Promise<unsigned_long> *params;
  undefined1 local_30 [8];
  ExceptionGuard guard;
  Promise<unsigned_long> *end_local;
  Promise<unsigned_long> *start_local;
  Promise<unsigned_long> *pos_local;
  
  guard.pos = end;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_30,pos);
  end_local = start;
  while (location = guard.start, end_local != guard.pos) {
    params = mv<kj::Promise<unsigned_long>>(end_local);
    ctor<kj::Promise<unsigned_long>,kj::Promise<unsigned_long>>(location,params);
    guard.start = guard.start + 1;
    end_local = end_local + 1;
  }
  local_30 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_30);
  return location;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }